

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O3

void test_cio_write_buffer_splice_empty_list(void)

{
  cio_write_buffer list_to_append;
  undefined8 **local_70;
  undefined8 **local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 **local_50;
  undefined8 **local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 **local_30;
  undefined8 **local_28;
  UNITY_INT local_20;
  undefined8 local_18;
  
  local_50 = &local_30;
  local_18 = 0;
  local_30 = &local_50;
  local_40 = 0;
  uStack_38 = 0;
  local_20 = 1;
  local_48 = local_50;
  local_28 = local_30;
  UnityAssertEqualNumber
            (1,1,"Number of elements in write buffer not correct!",0x10b,UNITY_DISPLAY_STYLE_INT);
  local_70 = &local_70;
  local_60 = 0;
  uStack_58 = 0;
  local_68 = local_70;
  UnityAssertEqualNumber
            (1,local_20,"Number of elements in write buffer not correct!",0x110,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_splice_empty_list(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wbe;
	cio_write_buffer_element_init(&wbe, NULL, 0);
	cio_write_buffer_queue_tail(&wbh, &wbe);
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Number of elements in write buffer not correct!");

	struct cio_write_buffer list_to_append;
	cio_write_buffer_head_init(&list_to_append);
	cio_write_buffer_splice(&list_to_append, &wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Number of elements in write buffer not correct!");
}